

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGetRuntimeDependenciesGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallGetRuntimeDependenciesGenerator::GenerateScriptForConfig
          (cmInstallGetRuntimeDependenciesGenerator *this,ostream *os,string *config,Indent indent)

{
  _Rb_tree_header *p_Var1;
  cmMakefile *this_00;
  Item *pIVar2;
  bool bVar3;
  string *psVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  postExcludeFiles;
  anon_class_48_3_25f25bd9 addPostExclude;
  string installNameTool;
  
  this_00 = this->LocalGenerator->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&postExcludeFiles,"CMAKE_INSTALL_NAME_TOOL",
             (allocator<char> *)&addPostExclude);
  psVar4 = cmMakefile::GetSafeDefinition(this_00,(string *)&postExcludeFiles);
  std::__cxx11::string::string((string *)&installNameTool,(string *)psVar4);
  std::__cxx11::string::~string((string *)&postExcludeFiles);
  poVar5 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  poVar5 = std::operator<<(poVar5,"file(GET_RUNTIME_DEPENDENCIES\n");
  poVar5 = ::operator<<(poVar5,(cmScriptGeneratorIndent)indent.Level);
  poVar5 = std::operator<<(poVar5,"  RESOLVED_DEPENDENCIES_VAR ");
  poVar5 = std::operator<<(poVar5,this->DepsVar);
  std::operator<<(poVar5,'\n');
  postExcludeFiles._M_t._M_impl._0_8_ = 0xb;
  postExcludeFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (long)"GRAPHVIZ_EXECUTABLES" + 9;
  anon_unknown.dwarf_1efef1d::WriteFilesArgument
            (os,(string_view *)&postExcludeFiles,&this->RuntimeDependencySet->Executables,config,
             (cmScriptGeneratorIndent)indent.Level);
  postExcludeFiles._M_t._M_impl._0_8_ = 9;
  postExcludeFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (long)"_STANDARD_LIBRARIES" + 10;
  anon_unknown.dwarf_1efef1d::WriteFilesArgument
            (os,(string_view *)&postExcludeFiles,&this->RuntimeDependencySet->Libraries,config,
             (cmScriptGeneratorIndent)indent.Level);
  postExcludeFiles._M_t._M_impl._0_8_ = 7;
  postExcludeFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (long)"CTEST_GIT_INIT_SUBMODULES" + 0x12;
  anon_unknown.dwarf_1efef1d::WriteFilesArgument
            (os,(string_view *)&postExcludeFiles,&this->RuntimeDependencySet->Modules,config,
             (cmScriptGeneratorIndent)indent.Level);
  if (this->RuntimeDependencySet->BundleExecutable != (Item *)0x0) {
    poVar5 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar5 = std::operator<<(poVar5,"  BUNDLE_EXECUTABLE \"");
    pIVar2 = this->RuntimeDependencySet->BundleExecutable;
    (*pIVar2->_vptr_Item[2])(&postExcludeFiles,pIVar2,config);
    poVar5 = std::operator<<(poVar5,(string *)&postExcludeFiles);
    std::operator<<(poVar5,"\"\n");
    std::__cxx11::string::~string((string *)&postExcludeFiles);
  }
  postExcludeFiles._M_t._M_impl._0_8_ = 0xb;
  postExcludeFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (long)"SUBDIRECTORIES" + 3;
  anon_unknown.dwarf_1efef1d::WriteGenexEvaluatorArgument
            (os,(string_view *)&postExcludeFiles,&this->Directories,config,this->LocalGenerator,
             (cmScriptGeneratorIndent)indent.Level);
  postExcludeFiles._M_t._M_impl._0_8_ = 0x13;
  postExcludeFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_111b60d;
  anon_unknown.dwarf_1efef1d::WriteGenexEvaluatorArgument
            (os,(string_view *)&postExcludeFiles,&this->PreIncludeRegexes,config,
             this->LocalGenerator,(cmScriptGeneratorIndent)indent.Level);
  postExcludeFiles._M_t._M_impl._0_8_ = 0x13;
  postExcludeFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_111b61a;
  anon_unknown.dwarf_1efef1d::WriteGenexEvaluatorArgument
            (os,(string_view *)&postExcludeFiles,&this->PreExcludeRegexes,config,
             this->LocalGenerator,(cmScriptGeneratorIndent)indent.Level);
  postExcludeFiles._M_t._M_impl._0_8_ = 0x14;
  postExcludeFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_111b627;
  anon_unknown.dwarf_1efef1d::WriteGenexEvaluatorArgument
            (os,(string_view *)&postExcludeFiles,&this->PostIncludeRegexes,config,
             this->LocalGenerator,(cmScriptGeneratorIndent)indent.Level);
  postExcludeFiles._M_t._M_impl._0_8_ = 0x14;
  postExcludeFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_111b634;
  anon_unknown.dwarf_1efef1d::WriteGenexEvaluatorArgument
            (os,(string_view *)&postExcludeFiles,&this->PostExcludeRegexes,config,
             this->LocalGenerator,(cmScriptGeneratorIndent)indent.Level);
  postExcludeFiles._M_t._M_impl._0_8_ = 0x12;
  postExcludeFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_111b641;
  anon_unknown.dwarf_1efef1d::WriteGenexEvaluatorArgument
            (os,(string_view *)&postExcludeFiles,&this->PostIncludeFiles,config,this->LocalGenerator
             ,(cmScriptGeneratorIndent)indent.Level);
  postExcludeFiles._M_t._M_impl._0_8_ = 0x12;
  postExcludeFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_111b64e;
  anon_unknown.dwarf_1efef1d::WriteGenexEvaluatorArgument
            (os,(string_view *)&postExcludeFiles,&this->PostExcludeFiles,config,this->LocalGenerator
             ,(cmScriptGeneratorIndent)indent.Level);
  p_Var1 = &postExcludeFiles._M_t._M_impl.super__Rb_tree_header;
  postExcludeFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       postExcludeFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  postExcludeFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  postExcludeFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  postExcludeFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  postExcludeFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::__cxx11::string::string((string *)&addPostExclude,(string *)config);
  addPostExclude.postExcludeFiles = &postExcludeFiles;
  addPostExclude.this = this;
  GenerateScriptForConfig::anon_class_48_3_25f25bd9::operator()
            (&addPostExclude,&this->RuntimeDependencySet->Executables);
  GenerateScriptForConfig::anon_class_48_3_25f25bd9::operator()
            (&addPostExclude,&this->RuntimeDependencySet->Libraries);
  GenerateScriptForConfig::anon_class_48_3_25f25bd9::operator()
            (&addPostExclude,&this->RuntimeDependencySet->Modules);
  bVar3 = true;
  p_Var6 = postExcludeFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var6 != p_Var1) {
    if (bVar3) {
      poVar5 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      std::operator<<(poVar5,"  POST_EXCLUDE_FILES_STRICT\n");
    }
    poVar5 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar5 = std::operator<<(poVar5,"    \"");
    poVar5 = std::operator<<(poVar5,(string *)(p_Var6 + 1));
    std::operator<<(poVar5,"\"\n");
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    bVar3 = false;
  }
  if ((installNameTool._M_string_length != 0) && (this->NoInstallRPath == false)) {
    poVar5 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar5 = std::operator<<(poVar5,"  RPATH_PREFIX ");
    poVar5 = std::operator<<(poVar5,this->RPathPrefix);
    std::operator<<(poVar5,'\n');
  }
  poVar5 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  std::operator<<(poVar5,"  )\n");
  std::__cxx11::string::~string((string *)&addPostExclude);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&postExcludeFiles._M_t);
  std::__cxx11::string::~string((string *)&installNameTool);
  return;
}

Assistant:

void cmInstallGetRuntimeDependenciesGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  std::string installNameTool =
    this->LocalGenerator->GetMakefile()->GetSafeDefinition(
      "CMAKE_INSTALL_NAME_TOOL");

  os << indent << "file(GET_RUNTIME_DEPENDENCIES\n"
     << indent << "  RESOLVED_DEPENDENCIES_VAR " << this->DepsVar << '\n';
  WriteFilesArgument(os, "EXECUTABLES"_s,
                     this->RuntimeDependencySet->GetExecutables(), config,
                     indent);
  WriteFilesArgument(os, "LIBRARIES"_s,
                     this->RuntimeDependencySet->GetLibraries(), config,
                     indent);
  WriteFilesArgument(os, "MODULES"_s, this->RuntimeDependencySet->GetModules(),
                     config, indent);
  if (this->RuntimeDependencySet->GetBundleExecutable()) {
    os << indent << "  BUNDLE_EXECUTABLE \""
       << this->RuntimeDependencySet->GetBundleExecutable()->GetItemPath(
            config)
       << "\"\n";
  }
  WriteGenexEvaluatorArgument(os, "DIRECTORIES"_s, this->Directories, config,
                              this->LocalGenerator, indent);
  WriteGenexEvaluatorArgument(os, "PRE_INCLUDE_REGEXES"_s,
                              this->PreIncludeRegexes, config,
                              this->LocalGenerator, indent);
  WriteGenexEvaluatorArgument(os, "PRE_EXCLUDE_REGEXES"_s,
                              this->PreExcludeRegexes, config,
                              this->LocalGenerator, indent);
  WriteGenexEvaluatorArgument(os, "POST_INCLUDE_REGEXES"_s,
                              this->PostIncludeRegexes, config,
                              this->LocalGenerator, indent);
  WriteGenexEvaluatorArgument(os, "POST_EXCLUDE_REGEXES"_s,
                              this->PostExcludeRegexes, config,
                              this->LocalGenerator, indent);
  WriteGenexEvaluatorArgument(os, "POST_INCLUDE_FILES"_s,
                              this->PostIncludeFiles, config,
                              this->LocalGenerator, indent);
  WriteGenexEvaluatorArgument(os, "POST_EXCLUDE_FILES"_s,
                              this->PostExcludeFiles, config,
                              this->LocalGenerator, indent);

  std::set<std::string> postExcludeFiles;
  auto const addPostExclude =
    [config, &postExcludeFiles, this](
      const std::vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item>>&
        tgts) {
      for (auto const& item : tgts) {
        item->AddPostExcludeFiles(config, postExcludeFiles,
                                  this->RuntimeDependencySet);
      }
    };
  addPostExclude(this->RuntimeDependencySet->GetExecutables());
  addPostExclude(this->RuntimeDependencySet->GetLibraries());
  addPostExclude(this->RuntimeDependencySet->GetModules());
  bool first = true;
  for (auto const& file : postExcludeFiles) {
    if (first) {
      os << indent << "  POST_EXCLUDE_FILES_STRICT\n";
      first = false;
    }
    os << indent << "    \"" << file << "\"\n";
  }

  if (!installNameTool.empty() && !this->NoInstallRPath) {
    os << indent << "  RPATH_PREFIX " << this->RPathPrefix << '\n';
  }
  os << indent << "  )\n";
}